

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O1

void set_top_object_offset_proc(Am_Object *cmd)

{
  int iVar1;
  Am_Value *pAVar2;
  Am_Ptr pvVar3;
  ostream *poVar4;
  Am_Object win;
  Am_Object AStack_28;
  Am_Object local_20;
  
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&AStack_28,10);
  Am_Object::~Am_Object(&AStack_28);
  pAVar2 = Am_Object::Get(&local_20,0xfa,0);
  pvVar3 = Am_Value::operator_cast_to_void_(pAVar2);
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&local_20,(ulong)Am_TOP_HOW);
  pAVar2 = Am_Object::Get(&AStack_28,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  *(int *)((long)pvVar3 + 4) = iVar1;
  Am_Object::~Am_Object(&AStack_28);
  iVar1 = *(int *)((long)pvVar3 + 0x28);
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&local_20,(ulong)Am_TOP_AMOUNT_WIDGET);
  Am_Object::Set(&AStack_28,0x169,iVar1,0);
  Am_Object::~Am_Object(&AStack_28);
  set_ref_grey(&local_20,false);
  pAVar2 = Am_Object::Get(cmd,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  if (iVar1 - 0x11U < 4) {
    iVar1 = *(int *)(&DAT_0028a8f0 + (ulong)(iVar1 - 0x11U) * 4);
    Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&local_20,(ulong)Am_SHOW_LOC_OBJ);
    Am_Object::Set(&AStack_28,0x65,iVar1,0);
    Am_Object::~Am_Object(&AStack_28);
    Am_Object::~Am_Object(&local_20);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Bad top control ",0x10);
  pAVar2 = Am_Object::Get(cmd,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,iVar1);
  std::endl<char,std::char_traits<char>>(poVar4);
  Am_Error();
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_top_object_offset, (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  loc_values->top_control = win.Get_Object(Am_TOP_HOW).Get(Am_VALUE);
  int val = loc_values->top_object_offset;
  win.Get_Object(Am_TOP_AMOUNT_WIDGET).Set(Am_VALUE, val);
  set_ref_grey(win, false);
  int y;
  switch ((int)cmd.Get(Am_VALUE)) {
  case am_change_offset_top_outside:
    y = REF_OBJ_TOP - SHOW_LOC_OBJ_SIZE - 1;
    break;
  case am_change_offset_top_inside:
    y = REF_OBJ_TOP + SHOW_LOC_OBJ_OFFSET;
    break;
  case am_change_offset_bottom_inside:
    y = REF_OBJ_TOP + REF_OBJ_SIZE - SHOW_LOC_OBJ_SIZE - SHOW_LOC_OBJ_OFFSET;
    break;
  case am_change_offset_bottom_outside:
    y = REF_OBJ_TOP + REF_OBJ_SIZE + 1;
    break;
  default:
    Am_ERROR("Bad top control " << (int)cmd.Get(Am_VALUE));
  }
  win.Get_Object(Am_SHOW_LOC_OBJ).Set(Am_TOP, y);
}